

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall
particleSamples::perform_resonance_feed_down
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list)

{
  vector<particle_info,_std::allocator<particle_info>_> *pvVar1;
  particle_decay *this_00;
  vector<particle_info,std::allocator<particle_info>> *this_01;
  undefined8 *******pppppppuVar2;
  undefined4 uVar3;
  int iVar4;
  _List_node_base *p_Var5;
  long lVar6;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar7;
  pointer paVar8;
  pointer paVar9;
  undefined8 *******pppppppuVar10;
  anon_struct_120_15_f999644b *paVar11;
  particle_info *ppVar12;
  undefined8 *puVar13;
  iterator __position;
  _List_node_base *p_Var14;
  long lVar15;
  byte bVar16;
  list<particle_info,_std::allocator<particle_info>_> current_ev_list;
  vector<particle_info,_std::allocator<particle_info>_> daughter_list;
  value_type part_i_1;
  particle_info in_stack_fffffffffffffe78;
  undefined8 *******local_110;
  undefined8 *******local_108;
  long local_100;
  vector<particle_info,_std::allocator<particle_info>_> local_f8;
  pointer local_d8;
  pointer local_d0;
  string local_c8;
  particle_info local_a8;
  
  bVar16 = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"perform resonance decays... ","");
  pretty_ostream::info(&this->messager,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_d0 = (input_particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (input_particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (local_d0 != local_d8) {
    lVar15 = 0;
    do {
      local_100 = 0;
      paVar8 = ((*local_d0)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      local_110 = &local_110;
      local_108 = &local_110;
      for (paVar7 = ((*local_d0)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)
                    ._M_impl.super__Vector_impl_data._M_start; paVar7 != paVar8; paVar7 = paVar7 + 1
          ) {
        p_Var5 = (_List_node_base *)operator_new(0x88);
        paVar9 = paVar7;
        p_Var14 = p_Var5 + 1;
        for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
          p_Var14->_M_next = *(_List_node_base **)paVar9;
          paVar9 = (pointer)((long)paVar9 + (ulong)bVar16 * -0x10 + 8);
          p_Var14 = (_List_node_base *)&p_Var14[-(ulong)bVar16]._M_prev;
        }
        std::__detail::_List_node_base::_M_hook(p_Var5);
        local_100 = local_100 + 1;
      }
      pvVar1 = (input_particle_list->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar15];
      paVar7 = (pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                   _M_impl.super__Vector_impl_data + 8) != paVar7) {
        *(pointer *)
         ((long)&(pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
                 .super__Vector_impl_data + 8) = paVar7;
      }
      while (pppppppuVar2 = local_110, local_100 != 0) {
        pppppppuVar10 = local_110 + 2;
        ppVar12 = &local_a8;
        for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined8 *******)ppVar12 = *pppppppuVar10;
          pppppppuVar10 = pppppppuVar10 + (ulong)bVar16 * -2 + 1;
          ppVar12 = (particle_info *)((long)ppVar12 + (ulong)bVar16 * -0x10 + 8);
        }
        local_100 = local_100 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pppppppuVar2);
        local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
        super__Vector_impl_data._M_start = (anon_struct_120_15_f999644b *)0x0;
        local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
        super__Vector_impl_data._M_finish = (anon_struct_120_15_f999644b *)0x0;
        local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        particle_decay::perform_decays(this->decayer_ptr,&local_a8,&local_f8);
        paVar7 = local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (paVar8 = local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                      _M_impl.super__Vector_impl_data._M_start; paVar8 != paVar7;
            paVar8 = paVar8 + 1) {
          this_00 = this->decayer_ptr;
          paVar11 = paVar8;
          puVar13 = (undefined8 *)&stack0xfffffffffffffe78;
          for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar13 = *(undefined8 *)paVar11;
            paVar11 = (anon_struct_120_15_f999644b *)((long)paVar11 + (ulong)bVar16 * -0x10 + 8);
            puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
          }
          iVar4 = particle_decay::check_particle_stable(this_00,in_stack_fffffffffffffe78);
          if (iVar4 == 1) {
            this_01 = (vector<particle_info,std::allocator<particle_info>> *)
                      (input_particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar15];
            __position._M_current = *(anon_struct_120_15_f999644b **)(this_01 + 8);
            if (__position._M_current == *(anon_struct_120_15_f999644b **)(this_01 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(this_01,__position,paVar8);
            }
            else {
              paVar11 = paVar8;
              for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
                uVar3 = *(undefined4 *)&paVar11->field_0x4;
                (__position._M_current)->monval = paVar11->monval;
                *(undefined4 *)&(__position._M_current)->field_0x4 = uVar3;
                paVar11 = (anon_struct_120_15_f999644b *)((long)paVar11 + (ulong)bVar16 * -0x10 + 8)
                ;
                __position._M_current = __position._M_current + (ulong)bVar16 * -0x10 + 8;
              }
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x78;
            }
          }
          else {
            p_Var5 = (_List_node_base *)operator_new(0x88);
            paVar11 = paVar8;
            p_Var14 = p_Var5 + 1;
            for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
              p_Var14->_M_next = *(_List_node_base **)paVar11;
              paVar11 = (anon_struct_120_15_f999644b *)((long)paVar11 + (ulong)bVar16 * -0x10 + 8);
              p_Var14 = (_List_node_base *)&p_Var14[-(ulong)bVar16]._M_prev;
            }
            std::__detail::_List_node_base::_M_hook(p_Var5);
            local_100 = local_100 + 1;
          }
        }
        if (local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
            super__Vector_impl_data._M_start != (anon_struct_120_15_f999644b *)0x0) {
          operator_delete(local_f8.super__Vector_base<particle_info,_std::allocator<particle_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_100 = 0;
      while ((undefined8 ********)pppppppuVar2 != &local_110) {
        pppppppuVar10 = (undefined8 *******)*pppppppuVar2;
        operator_delete(pppppppuVar2);
        pppppppuVar2 = pppppppuVar10;
      }
      lVar15 = lVar15 + 1;
      local_d0 = local_d0 + 1;
    } while (local_d0 != local_d8);
  }
  return;
}

Assistant:

void particleSamples::perform_resonance_feed_down(
    vector<vector<particle_info> *> *input_particle_list) {
    messager.info("perform resonance decays... ");
    // loop over events
    int ievent = 0;
    for (auto &ev_i : (*input_particle_list)) {
        // create a temporary particle list
        std::list<particle_info> current_ev_list;

        // copy all particles into the temp list
        for (auto &part_i : (*ev_i)) {
            current_ev_list.push_back(part_i);
        }

        (*input_particle_list)[ievent]->clear();

        // perform resonance decays
        while (current_ev_list.size() > 0) {
            auto part_i = current_ev_list.front();
            current_ev_list.pop_front();
            vector<particle_info> daughter_list;
            decayer_ptr->perform_decays(part_i, daughter_list);
            for (auto &daughter_i : daughter_list) {
                if (decayer_ptr->check_particle_stable(daughter_i) == 1) {
                    (*input_particle_list)[ievent]->push_back(daughter_i);
                } else {
                    current_ev_list.push_back(daughter_i);
                }
            }
            daughter_list.clear();
        }
        current_ev_list.clear();
        ievent++;
    }
}